

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O3

int __thiscall zmq::udp_engine_t::init(udp_engine_t *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  fd_t s_;
  bool in_CL;
  bool in_DL;
  udp_engine_t *ctx_00;
  
  ctx_00 = this;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    init((EVP_PKEY_CTX *)this);
  }
  if (in_DL == false && in_CL == false) {
    init((EVP_PKEY_CTX *)ctx_00);
  }
  this->_send_enabled = in_DL;
  this->_recv_enabled = in_CL;
  this->_address = (address_t *)ctx;
  iVar1 = udp_address_t::family(*(udp_address_t **)(ctx + 0x48));
  s_ = open_socket(iVar1,2,0x11);
  this->_fd = s_;
  if (s_ == -1) {
    iVar1 = -1;
  }
  else {
    unblock_socket(s_);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int zmq::udp_engine_t::init (address_t *address_, bool send_, bool recv_)
{
    zmq_assert (address_);
    zmq_assert (send_ || recv_);
    _send_enabled = send_;
    _recv_enabled = recv_;
    _address = address_;

    _fd = open_socket (_address->resolved.udp_addr->family (), SOCK_DGRAM,
                       IPPROTO_UDP);
    if (_fd == retired_fd)
        return -1;

    unblock_socket (_fd);

    return 0;
}